

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::AssertionPrinter::AssertionPrinter
          (AssertionPrinter *this,ostream *_stream,AssertionStats *_stats)

{
  bool bVar1;
  OfType OVar2;
  size_type sVar3;
  pointer in_RDX;
  pointer in_RSI;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *in_RDI;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  AssertionResult *this_00;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *__x;
  
  (in_RDI->super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>)._M_impl.
  super__Vector_impl_data._M_start = in_RSI;
  (in_RDI->super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>)._M_impl.
  super__Vector_impl_data._M_finish = in_RDX;
  (in_RDI->super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&in_RDX->field_0x8;
  *(undefined4 *)
   &in_RDI[1].super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
    super__Vector_impl_data._M_start = 0;
  __x = in_RDI;
  std::__cxx11::string::string
            ((string *)
             &in_RDI[1].super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::string
            ((string *)
             &in_RDI[2].super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  AssertionResult::getMessage_abi_cxx11_
            ((AssertionResult *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  this_00 = (AssertionResult *)
            &in_RDI[5].super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector(unaff_retaddr,__x);
  OVar2 = AssertionResult::getResultType
                    ((AssertionResult *)
                     (in_RDI->
                     super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>).
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (OVar2 != Unknown) {
    if (OVar2 == Ok) {
      *(undefined4 *)
       &in_RDI[1].super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
        _M_impl.super__Vector_impl_data._M_start = 3;
      std::__cxx11::string::operator=
                ((string *)
                 &in_RDI[1].
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish,"PASSED");
      sVar3 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                        ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                         &in_RDX[1].type);
      if (sVar3 == 1) {
        std::__cxx11::string::operator=
                  ((string *)
                   &in_RDI[2].
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,"with message");
      }
      sVar3 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                        ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                         &in_RDX[1].type);
      if (sVar3 < 2) {
        return;
      }
      std::__cxx11::string::operator=
                ((string *)
                 &in_RDI[2].
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,"with messages");
      return;
    }
    if (OVar2 == Info) {
      std::__cxx11::string::operator=
                ((string *)
                 &in_RDI[2].
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,"info");
      return;
    }
    if (OVar2 == Warning) {
      std::__cxx11::string::operator=
                ((string *)
                 &in_RDI[2].
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,"warning");
      return;
    }
    if (OVar2 != FailureBit) {
      if (OVar2 == ExpressionFailed) {
        bVar1 = AssertionResult::isOk(this_00);
        if (bVar1) {
          *(undefined4 *)
           &in_RDI[1].super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
            _M_impl.super__Vector_impl_data._M_start = 3;
          std::__cxx11::string::operator=
                    ((string *)
                     &in_RDI[1].
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_finish,"FAILED - but was ok");
        }
        else {
          *(undefined4 *)
           &in_RDI[1].super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
            _M_impl.super__Vector_impl_data._M_start = 0x12;
          std::__cxx11::string::operator=
                    ((string *)
                     &in_RDI[1].
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_finish,"FAILED");
        }
        sVar3 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                          ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                           &in_RDX[1].type);
        if (sVar3 == 1) {
          std::__cxx11::string::operator=
                    ((string *)
                     &in_RDI[2].
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,"with message");
        }
        sVar3 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                          ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                           &in_RDX[1].type);
        if (sVar3 < 2) {
          return;
        }
        std::__cxx11::string::operator=
                  ((string *)
                   &in_RDI[2].
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,"with messages");
        return;
      }
      if (OVar2 == ExplicitFailure) {
        std::__cxx11::string::operator=
                  ((string *)
                   &in_RDI[1].
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish,"FAILED");
        *(undefined4 *)
         &in_RDI[1].super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
          _M_impl.super__Vector_impl_data._M_start = 0x12;
        sVar3 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                          ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                           &in_RDX[1].type);
        if (sVar3 == 1) {
          std::__cxx11::string::operator=
                    ((string *)
                     &in_RDI[2].
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,"explicitly with message");
        }
        sVar3 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::size
                          ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                           &in_RDX[1].type);
        if (sVar3 < 2) {
          return;
        }
        std::__cxx11::string::operator=
                  ((string *)
                   &in_RDI[2].
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,"explicitly with messages");
        return;
      }
      if (OVar2 != Exception) {
        if (OVar2 == ThrewException) {
          *(undefined4 *)
           &in_RDI[1].super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
            _M_impl.super__Vector_impl_data._M_start = 0x12;
          std::__cxx11::string::operator=
                    ((string *)
                     &in_RDI[1].
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_finish,"FAILED");
          std::__cxx11::string::operator=
                    ((string *)
                     &in_RDI[2].
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                     "due to unexpected exception with message");
          return;
        }
        if (OVar2 != DidntThrowException) {
          return;
        }
        *(undefined4 *)
         &in_RDI[1].super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
          _M_impl.super__Vector_impl_data._M_start = 0x12;
        std::__cxx11::string::operator=
                  ((string *)
                   &in_RDI[1].
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish,"FAILED");
        std::__cxx11::string::operator=
                  ((string *)
                   &in_RDI[2].
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                   "because no exception was thrown where one was expected");
        return;
      }
    }
  }
  std::__cxx11::string::operator=
            ((string *)
             &in_RDI[1].super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
              _M_impl.super__Vector_impl_data._M_finish,"** internal error **");
  *(undefined4 *)
   &in_RDI[1].super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
    super__Vector_impl_data._M_start = 0x12;
  return;
}

Assistant:

AssertionPrinter( std::ostream& _stream, AssertionStats const& _stats )
            :   stream( _stream ),
                stats( _stats ),
                result( _stats.assertionResult ),
                colour( Colour::None ),
                message( result.getMessage() ),
                messages( _stats.infoMessages )
            {
                switch( result.getResultType() ) {
                    case ResultWas::Ok:
                        colour = Colour::Success;
                        passOrFail = "PASSED";
                        //if( result.hasMessage() )
                        if( _stats.infoMessages.size() == 1 )
                            messageLabel = "with message";
                        if( _stats.infoMessages.size() > 1 )
                            messageLabel = "with messages";
                        break;
                    case ResultWas::ExpressionFailed:
                        if( result.isOk() ) {
                            colour = Colour::Success;
                            passOrFail = "FAILED - but was ok";
                        }
                        else {
                            colour = Colour::Error;
                            passOrFail = "FAILED";
                        }
                        if( _stats.infoMessages.size() == 1 )
                            messageLabel = "with message";
                        if( _stats.infoMessages.size() > 1 )
                            messageLabel = "with messages";
                        break;
                    case ResultWas::ThrewException:
                        colour = Colour::Error;
                        passOrFail = "FAILED";
                        messageLabel = "due to unexpected exception with message";
                        break;
                    case ResultWas::DidntThrowException:
                        colour = Colour::Error;
                        passOrFail = "FAILED";
                        messageLabel = "because no exception was thrown where one was expected";
                        break;
                    case ResultWas::Info:
                        messageLabel = "info";
                        break;
                    case ResultWas::Warning:
                        messageLabel = "warning";
                        break;
                    case ResultWas::ExplicitFailure:
                        passOrFail = "FAILED";
                        colour = Colour::Error;
                        if( _stats.infoMessages.size() == 1 )
                            messageLabel = "explicitly with message";
                        if( _stats.infoMessages.size() > 1 )
                            messageLabel = "explicitly with messages";
                        break;
                    // These cases are here to prevent compiler warnings
                    case ResultWas::Unknown:
                    case ResultWas::FailureBit:
                    case ResultWas::Exception:
                        passOrFail = "** internal error **";
                        colour = Colour::Error;
                        break;
                }
            }